

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS ref_search_insert(REF_SEARCH ref_search,REF_INT item,REF_DBL *position,REF_DBL radius)

{
  int child;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT location;
  REF_INT i;
  REF_DBL radius_local;
  REF_DBL *position_local;
  REF_INT item_local;
  REF_SEARCH ref_search_local;
  
  if (ref_search->empty < ref_search->n) {
    if (item < 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x7e
             ,"ref_search_insert",3,"item can not be negative");
      ref_search_local._4_4_ = 3;
    }
    else {
      child = ref_search->empty;
      ref_search->empty = ref_search->empty + 1;
      ref_search->item[child] = item;
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_search->d;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        ref_search->pos[ref_private_macro_code_rss + ref_search->d * child] =
             position[ref_private_macro_code_rss];
      }
      ref_search->radius[child] = radius;
      ref_search_local._4_4_ = ref_search_home(ref_search,child,0);
      if (ref_search_local._4_4_ == 0) {
        ref_search_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x88,"ref_search_insert",(ulong)ref_search_local._4_4_,"top level home");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x7c,
           "ref_search_insert",7,"need larger tree for more items");
    ref_search_local._4_4_ = 7;
  }
  return ref_search_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_search_insert(REF_SEARCH ref_search, REF_INT item,
                                     REF_DBL *position, REF_DBL radius) {
  REF_INT i, location;
  if (ref_search->empty >= ref_search->n)
    RSS(REF_INCREASE_LIMIT, "need larger tree for more items");

  if (item < 0) RSS(REF_INVALID, "item can not be negative");

  location = ref_search->empty;
  (ref_search->empty)++;

  ref_search->item[location] = item;
  for (i = 0; i < ref_search->d; i++)
    ref_search->pos[i + ref_search->d * location] = position[i];
  ref_search->radius[location] = radius;

  RSS(ref_search_home(ref_search, location, 0), "top level home");

  return REF_SUCCESS;
}